

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

CollSeq * findCollSeqEntry(sqlite3 *db,char *zName,int create)

{
  int iVar1;
  sqlite3 *db_00;
  int in_EDX;
  void *in_RSI;
  void *in_RDI;
  char *unaff_retaddr;
  CollSeq *pDel;
  int nName;
  CollSeq *pColl;
  char *in_stack_ffffffffffffffc8;
  sqlite3 *in_stack_ffffffffffffffd0;
  CollSeq *local_20;
  
  local_20 = (CollSeq *)sqlite3HashFind((Hash *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
  ;
  if ((local_20 == (CollSeq *)0x0) && (in_EDX != 0)) {
    iVar1 = sqlite3Strlen30(in_stack_ffffffffffffffc8);
    local_20 = (CollSeq *)
               sqlite3DbMallocZero(in_stack_ffffffffffffffd0,(u64)in_stack_ffffffffffffffc8);
    if (local_20 != (CollSeq *)0x0) {
      local_20->zName = (char *)(local_20 + 3);
      local_20->enc = '\x01';
      local_20[1].zName = (char *)(local_20 + 3);
      local_20[1].enc = '\x02';
      local_20[2].zName = (char *)(local_20 + 3);
      local_20[2].enc = '\x03';
      memcpy(local_20->zName,in_RSI,(long)(iVar1 + 1));
      db_00 = (sqlite3 *)sqlite3HashInsert((Hash *)pDel,unaff_retaddr,in_RDI);
      if (db_00 != (sqlite3 *)0x0) {
        sqlite3OomFault(db_00);
        sqlite3DbFree(db_00,in_stack_ffffffffffffffc8);
        local_20 = (CollSeq *)0x0;
      }
    }
  }
  return local_20;
}

Assistant:

static CollSeq *findCollSeqEntry(
  sqlite3 *db,          /* Database connection */
  const char *zName,    /* Name of the collating sequence */
  int create            /* Create a new entry if true */
){
  CollSeq *pColl;
  pColl = sqlite3HashFind(&db->aCollSeq, zName);

  if( 0==pColl && create ){
    int nName = sqlite3Strlen30(zName) + 1;
    pColl = sqlite3DbMallocZero(db, 3*sizeof(*pColl) + nName);
    if( pColl ){
      CollSeq *pDel = 0;
      pColl[0].zName = (char*)&pColl[3];
      pColl[0].enc = SQLITE_UTF8;
      pColl[1].zName = (char*)&pColl[3];
      pColl[1].enc = SQLITE_UTF16LE;
      pColl[2].zName = (char*)&pColl[3];
      pColl[2].enc = SQLITE_UTF16BE;
      memcpy(pColl[0].zName, zName, nName);
      pDel = sqlite3HashInsert(&db->aCollSeq, pColl[0].zName, pColl);

      /* If a malloc() failure occurred in sqlite3HashInsert(), it will
      ** return the pColl pointer to be deleted (because it wasn't added
      ** to the hash table).
      */
      assert( pDel==0 || pDel==pColl );
      if( pDel!=0 ){
        sqlite3OomFault(db);
        sqlite3DbFree(db, pDel);
        pColl = 0;
      }
    }
  }
  return pColl;
}